

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FenceVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::FenceVkImpl::AddPendingSyncPoint
          (FenceVkImpl *this,SoftwareQueueIndex CommandQueueId,Uint64 Value,
          SyncPointVkPtr *SyncPoint)

{
  _Elt_pointer pSVar1;
  _Map_pointer ppSVar2;
  int iVar3;
  _Elt_pointer pSVar4;
  _Elt_pointer pSVar5;
  string msg;
  Uint64 LastValue;
  char (*in_stack_ffffffffffffffa8) [117];
  uchar local_49;
  string local_48;
  pointer local_28;
  pointer local_20;
  
  local_49 = CommandQueueId.m_Value;
  local_28 = (pointer)Value;
  if ((this->m_TimelineSemaphore).m_VkObject == (VkSemaphore_T *)0x0) {
    if ((SyncPoint->super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
        (element_type *)0x0) {
      FenceBase<Diligent::EngineVkImplTraits>::DvpSignal
                (&this->super_FenceBase<Diligent::EngineVkImplTraits>,Value);
      iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->m_SyncPointsGuard);
      if (iVar3 == 0) {
        pSVar4 = (this->m_SyncPoints).
                 super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pSVar4 == (this->m_SyncPoints).
                      super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          local_20 = (pointer)(this->super_FenceBase<Diligent::EngineVkImplTraits>).
                              m_LastCompletedFenceValue.super___atomic_base<unsigned_long>._M_i;
        }
        else {
          if (pSVar4 == (this->m_SyncPoints).
                        super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            pSVar4 = (this->m_SyncPoints).
                     super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
          }
          local_20 = (pointer)pSVar4[-1].Value;
        }
        if (local_28 <= local_20) {
          FormatString<char[12],unsigned_long,char[40],unsigned_long,char[2]>
                    (&local_48,(Diligent *)"New value (",(char (*) [12])&local_28,
                     (unsigned_long *)") must be greater than previous value (",
                     (char (*) [40])&local_20,(unsigned_long *)0x930f15,
                     (char (*) [2])in_stack_ffffffffffffffa8);
          DebugAssertionFailed
                    (local_48._M_dataplus._M_p,"AddPendingSyncPoint",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
                     ,0x127);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p != &local_48.field_2) {
            operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
          }
        }
        pSVar4 = (this->m_SyncPoints).
                 super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pSVar4 != (this->m_SyncPoints).
                      super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          pSVar1 = (this->m_SyncPoints).
                   super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_first;
          pSVar5 = pSVar4;
          if (pSVar4 == pSVar1) {
            pSVar5 = (this->m_SyncPoints).
                     super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
          }
          if (((pSVar5[-1].SyncPoint.
                super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_CommandQueueId).m_Value != local_49) {
            if (pSVar4 == pSVar1) {
              pSVar4 = (this->m_SyncPoints).
                       super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
            }
            local_20 = (pointer)CONCAT71(local_20._1_7_,
                                         ((pSVar4[-1].SyncPoint.
                                           super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->m_CommandQueueId).m_Value);
            FormatString<char[54],Diligent::IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>,char[54],Diligent::IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>,char[117]>
                      (&local_48,(Diligent *)"Fence enqueued for signal operation in command queue "
                       ,(char (*) [54])&local_49,
                       (IndexWrapper<unsigned_char,_Diligent::_SoftwareQueueIndexTag> *)
                       ", but previous signal operation was in command queue ",
                       (char (*) [54])&local_20,
                       (IndexWrapper<unsigned_char,_Diligent::_SoftwareQueueIndexTag> *)
                       ". This may cause data race or deadlock. Call Wait() to ensure that all pending signal operation have been completed."
                       ,in_stack_ffffffffffffffa8);
            DebugAssertionFailed
                      (local_48._M_dataplus._M_p,"AddPendingSyncPoint",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
                       ,0x12e);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_48._M_dataplus._M_p != &local_48.field_2) {
              operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
            }
          }
        }
        ppSVar2 = (this->m_SyncPoints).
                  super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node;
        if (8 < ((long)(this->m_SyncPoints).
                       super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_last -
                 (long)(this->m_SyncPoints).
                       super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x5555555555555555 +
                ((long)(this->m_SyncPoints).
                       super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                 (long)(this->m_SyncPoints).
                       super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) *
                -0x5555555555555555 +
                (((long)ppSVar2 -
                  (long)(this->m_SyncPoints).
                        super__Deque_base<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                (ulong)(ppSVar2 == (_Map_pointer)0x0)) * 0x15) {
          InternalGetCompletedValue(this);
        }
        local_48._M_dataplus._M_p = local_28;
        local_48._M_string_length =
             (size_type)
             (SyncPoint->super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
        local_48.field_2._M_allocated_capacity =
             (size_type)
             (SyncPoint->super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
        (SyncPoint->super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>).
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (SyncPoint->super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)0x0;
        std::
        deque<Diligent::FenceVkImpl::SyncPointData,_std::allocator<Diligent::FenceVkImpl::SyncPointData>_>
        ::emplace_back<Diligent::FenceVkImpl::SyncPointData>
                  (&this->m_SyncPoints,(SyncPointData *)&local_48);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.field_2._M_allocated_capacity
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_48.field_2._M_allocated_capacity);
        }
        pthread_mutex_unlock((pthread_mutex_t *)&this->m_SyncPointsGuard);
        return;
      }
      std::__throw_system_error(iVar3);
    }
    FormatString<char[18]>(&local_48,(char (*) [18])"SyncPoint is null");
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"AddPendingSyncPoint",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
               ,0x11b);
  }
  else {
    FormatString<char[46]>(&local_48,(char (*) [46])"Not supported when timeline semaphore is used")
    ;
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"AddPendingSyncPoint",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
               ,0x116);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FenceVkImpl::AddPendingSyncPoint(SoftwareQueueIndex CommandQueueId, Uint64 Value, SyncPointVkPtr SyncPoint)
{
    if (IsTimelineSemaphore())
    {
        DEV_ERROR("Not supported when timeline semaphore is used");
        return;
    }
    if (SyncPoint == nullptr)
    {
        UNEXPECTED("SyncPoint is null");
        return;
    }

    DvpSignal(Value);

    std::lock_guard<std::mutex> Lock{m_SyncPointsGuard};

#ifdef DILIGENT_DEVELOPMENT
    {
        const Uint64 LastValue = m_SyncPoints.empty() ? m_LastCompletedFenceValue.load() : m_SyncPoints.back().Value;
        DEV_CHECK_ERR(Value > LastValue,
                      "New value (", Value, ") must be greater than previous value (", LastValue, ")");
    }
    if (!m_SyncPoints.empty())
    {
        DEV_CHECK_ERR(m_SyncPoints.back().SyncPoint->GetCommandQueueId() == CommandQueueId,
                      "Fence enqueued for signal operation in command queue ", CommandQueueId,
                      ", but previous signal operation was in command queue ", m_SyncPoints.back().SyncPoint->GetCommandQueueId(),
                      ". This may cause data race or deadlock. Call Wait() to ensure that all pending signal operation have been completed.");
    }
#endif

    // If IFence is used only for synchronization between queues it will accumulate many more sync points.
    // We need to check VkFence and remove already reached sync points.
    if (m_SyncPoints.size() > RequiredArraySize)
    {
        InternalGetCompletedValue();
    }

    m_SyncPoints.push_back({Value, std::move(SyncPoint)});
}